

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[25],char_const*,char[43],unsigned_int,char[41],char_const*,char[30]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [25],char **RestArgs,char (*RestArgs_1) [43],uint *RestArgs_2,
               char (*RestArgs_3) [41],char **RestArgs_4,char (*RestArgs_5) [30])

{
  char (*RestArgs_local_3) [41];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [43];
  char **RestArgs_local;
  char (*FirstArg_local) [25];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[25]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[43],unsigned_int,char[41],char_const*,char[30]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}